

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_rsqrt2_s_mips64el(CPUMIPSState_conflict10 *env,uint32_t fst0,uint32_t fst2)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t fst2_local;
  uint32_t fst0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = float32_mul_mips64el(fst0,fst2,&(env->active_fpu).fp_status);
  fVar1 = float32_sub_mips64el(fVar1,0x3f800000,&(env->active_fpu).fp_status);
  fVar1 = float32_div_mips64el(fVar1,0x40000000,&(env->active_fpu).fp_status);
  fVar1 = float32_chs(fVar1);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint32_t helper_float_rsqrt2_s(CPUMIPSState *env, uint32_t fst0, uint32_t fst2)
{
    fst2 = float32_mul(fst0, fst2, &env->active_fpu.fp_status);
    fst2 = float32_sub(fst2, float32_one, &env->active_fpu.fp_status);
    fst2 = float32_chs(float32_div(fst2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fst2;
}